

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O0

uint32_t __thiscall
google::protobuf::internal::ReflectionSchema::GetFieldOffset
          (ReflectionSchema *this,FieldDescriptor *field)

{
  uint32_t v;
  bool bVar1;
  int iVar2;
  Type type;
  Descriptor *this_00;
  OneofDescriptor *this_01;
  char *pcVar3;
  int __c;
  FieldDescriptor *__s;
  size_t offset;
  FieldDescriptor *field_local;
  ReflectionSchema *this_local;
  
  __s = field;
  bVar1 = InRealOneof(this,field);
  if (bVar1) {
    this_00 = FieldDescriptor::containing_type(field);
    iVar2 = Descriptor::field_count(this_00);
    this_01 = FieldDescriptor::containing_oneof(field);
    pcVar3 = OneofDescriptor::index(this_01,(char *)__s,__c);
    v = this->offsets_[(long)iVar2 + (long)(int)pcVar3];
    type = FieldDescriptor::type(field);
    this_local._4_4_ = OffsetValue(v,type);
  }
  else {
    this_local._4_4_ = GetFieldOffsetNonOneof(this,field);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t GetFieldOffset(const FieldDescriptor* field) const {
    if (InRealOneof(field)) {
      size_t offset =
          static_cast<size_t>(field->containing_type()->field_count()) +
          field->containing_oneof()->index();
      return OffsetValue(offsets_[offset], field->type());
    } else {
      return GetFieldOffsetNonOneof(field);
    }
  }